

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O2

void __thiscall HighsLpRelaxation::setObjectiveLimit(HighsLpRelaxation *this,double objlim)

{
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var1;
  ulong in_XMM0_Qb;
  double dVar2;
  allocator local_59;
  double local_58;
  ulong uStack_50;
  double local_48;
  string local_30;
  
  _Var1._M_head_impl =
       (this->mipsolver->mipdata_)._M_t.
       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
       super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  dVar2 = *(double *)((long)&(_Var1._M_head_impl)->objectiveFunction + 8);
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    uStack_50 = 0;
    local_58 = 0.5 / dVar2;
  }
  else {
    dVar2 = (_Var1._M_head_impl)->feastol * 1000.0;
    uStack_50 = in_XMM0_Qb & 0x7fffffffffffffff;
    local_58 = ABS(objlim) * 1e-14;
    if (ABS(objlim) * 1e-14 <= dVar2) {
      local_58 = dVar2;
    }
  }
  local_48 = objlim;
  std::__cxx11::string::string((string *)&local_30,"objective_bound",&local_59);
  Highs::setOptionValue(&this->lpsolver,&local_30,local_58 + local_48);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void HighsLpRelaxation::setObjectiveLimit(double objlim) {
  double offset;
  if (mipsolver.mipdata_->objectiveFunction.isIntegral())
    offset = 0.5 / mipsolver.mipdata_->objectiveFunction.integralScale();
  else
    offset = std::max(1000.0 * mipsolver.mipdata_->feastol,
                      std::abs(objlim) * kHighsTiny);

  lpsolver.setOptionValue("objective_bound", objlim + offset);
}